

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

void __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::releaseExport
          (RpcConnectionState *this,ExportId id,uint refcount)

{
  uint uVar1;
  Export *pEVar2;
  Disposer *pDVar3;
  ClientHook *pCVar4;
  undefined8 *puVar5;
  PromiseNode *pPVar6;
  ulong uVar7;
  Disposer *disposerCopy;
  ulong uVar8;
  Fault f;
  Fault local_60;
  uint local_58;
  Disposer *local_50;
  ClientHook *local_48;
  undefined8 *local_40;
  PromiseNode *local_38;
  
  uVar7 = (ulong)id;
  pEVar2 = (this->exports).slots.builder.ptr;
  uVar8 = ((long)(this->exports).slots.builder.pos - (long)pEVar2 >> 3) * -0x3333333333333333;
  if ((uVar8 < uVar7 || uVar8 - uVar7 == 0) || (uVar1 = pEVar2[uVar7].refcount, uVar1 == 0)) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36]>
              (&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
               ,0xa65,FAILED,(char *)0x0,"\"Tried to release invalid export ID.\"",
               (char (*) [36])"Tried to release invalid export ID.");
    kj::_::Debug::Fault::~Fault(&local_60);
  }
  else if (uVar1 < refcount) {
    _GLOBAL__N_1::RpcConnectionState::releaseExport();
  }
  else {
    pEVar2[uVar7].refcount = uVar1 - refcount;
    if (uVar1 - refcount == 0) {
      local_60.exception = (Exception *)pEVar2[uVar7].clientHook.ptr;
      std::
      _Hashtable<capnp::ClientHook_*,_std::pair<capnp::ClientHook_*const,_unsigned_int>,_std::allocator<std::pair<capnp::ClientHook_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<capnp::ClientHook_*>,_std::hash<capnp::ClientHook_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->exportsByCap)._M_h,&local_60);
      local_60.exception._0_4_ = id;
      pEVar2 = (this->exports).slots.builder.ptr;
      local_58 = pEVar2[uVar7].refcount;
      pDVar3 = pEVar2[uVar7].clientHook.disposer;
      pCVar4 = pEVar2[uVar7].clientHook.ptr;
      pEVar2[uVar7].clientHook.ptr = (ClientHook *)0x0;
      puVar5 = &(pEVar2[uVar7].resolveOp.super_PromiseBase.node.disposer)->_vptr_Disposer;
      pPVar6 = pEVar2[uVar7].resolveOp.super_PromiseBase.node.ptr;
      pEVar2[uVar7].refcount = 0;
      pEVar2[uVar7].clientHook.disposer = (Disposer *)0x0;
      pEVar2[uVar7].clientHook.ptr = (ClientHook *)0x0;
      pEVar2[uVar7].resolveOp.super_PromiseBase.node.disposer = (Disposer *)0x0;
      pEVar2[uVar7].resolveOp.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      local_50 = pDVar3;
      local_48 = pCVar4;
      local_40 = puVar5;
      local_38 = pPVar6;
      std::
      priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
      ::push(&(this->exports).freeIds,(value_type *)&local_60);
      if (pPVar6 != (PromiseNode *)0x0) {
        local_38 = (PromiseNode *)0x0;
        (**(code **)*puVar5)
                  (puVar5,(_func_int *)
                          ((long)&pPVar6->_vptr_PromiseNode + (long)pPVar6->_vptr_PromiseNode[-2]));
      }
      if (pCVar4 != (ClientHook *)0x0) {
        (**pDVar3->_vptr_Disposer)
                  (pDVar3,(_func_int *)
                          ((long)&pCVar4->_vptr_ClientHook + (long)pCVar4->_vptr_ClientHook[-2]));
      }
    }
  }
  return;
}

Assistant:

void releaseExport(ExportId id, uint refcount) {
    KJ_IF_MAYBE(exp, exports.find(id)) {
      KJ_REQUIRE(refcount <= exp->refcount, "Tried to drop export's refcount below zero.") {
        return;
      }

      exp->refcount -= refcount;
      if (exp->refcount == 0) {
        exportsByCap.erase(exp->clientHook);
        exports.erase(id, *exp);
      }
    } else {
      KJ_FAIL_REQUIRE("Tried to release invalid export ID.") {
        return;
      }